

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_upvaluejoin(lua_State *L)

{
  GCobj *v;
  int iVar1;
  int32_t iVar2;
  GCfunc *pGVar3;
  long lVar4;
  GCRef *p [2];
  GCfunc *fn [2];
  GCobj *local_38 [4];
  
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 4) {
      v = *(GCobj **)local_38[1];
      *(GCobj **)local_38[0] = v;
      if ((((v->gch).marked & 3) != 0) && (((local_38[2]->gch).marked & 4) != 0)) {
        lj_gc_barrierf((global_State *)(L->glref).ptr64,local_38[2],v);
      }
      return 0;
    }
    iVar1 = (int)lVar4;
    pGVar3 = lj_lib_checkfunc(L,iVar1 + 1);
    *(GCfunc **)((long)local_38 + lVar4 * 4 + 0x10) = pGVar3;
    if ((pGVar3->c).ffid != '\0') break;
    iVar2 = lj_lib_checkint(L,iVar1 + 2);
    if ((uint)(pGVar3->c).nupvalues <= iVar2 - 1U) {
      lj_err_arg(L,iVar1 + 2,LJ_ERR_IDXRNG);
    }
    *(ulong *)((long)local_38 + lVar4 * 4) = (long)pGVar3 + (ulong)(iVar2 - 1U) * 8 + 0x28;
    lVar4 = lVar4 + 2;
  }
  lj_err_arg(L,iVar1 + 1,LJ_ERR_NOLFUNC);
}

Assistant:

LJLIB_CF(debug_upvaluejoin)
{
  GCfunc *fn[2];
  GCRef *p[2];
  int i;
  for (i = 0; i < 2; i++) {
    int32_t n;
    fn[i] = lj_lib_checkfunc(L, 2*i+1);
    if (!isluafunc(fn[i]))
      lj_err_arg(L, 2*i+1, LJ_ERR_NOLFUNC);
    n = lj_lib_checkint(L, 2*i+2) - 1;
    if ((uint32_t)n >= fn[i]->l.nupvalues)
      lj_err_arg(L, 2*i+2, LJ_ERR_IDXRNG);
    p[i] = &fn[i]->l.uvptr[n];
  }
  setgcrefr(*p[0], *p[1]);
  lj_gc_objbarrier(L, fn[0], gcref(*p[1]));
  return 0;
}